

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keepalive.c
# Opt level: O0

int libssh2_keepalive_send(LIBSSH2_SESSION *session,int *seconds_to_next)

{
  int iVar1;
  int rc;
  size_t len;
  uchar keepalive_data [28];
  time_t now;
  int *seconds_to_next_local;
  LIBSSH2_SESSION *session_local;
  
  if (session->keepalive_interval == 0) {
    if (seconds_to_next != (int *)0x0) {
      *seconds_to_next = 0;
    }
  }
  else {
    register0x00000000 = time((time_t *)0x0);
    if (register0x00000000 < session->keepalive_last_sent + (long)session->keepalive_interval) {
      if (seconds_to_next != (int *)0x0) {
        *seconds_to_next =
             ((int)session->keepalive_last_sent - (int)register0x00000000) +
             session->keepalive_interval;
      }
    }
    else {
      len = 0x65656b1500000050;
      builtin_memcpy(keepalive_data,"palive@libssh2.orgW",0x14);
      iVar1 = _libssh2_transport_send(session,(uchar *)&len,0x1b,(uchar *)0x0,0);
      if ((iVar1 != 0) && (iVar1 != -0x25)) {
        _libssh2_error(session,-7,"Unable to send keepalive message");
        return iVar1;
      }
      session->keepalive_last_sent = stack0xffffffffffffffd8;
      if (seconds_to_next != (int *)0x0) {
        *seconds_to_next = session->keepalive_interval;
      }
    }
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_keepalive_send (LIBSSH2_SESSION *session,
                        int *seconds_to_next)
{
    time_t now;

    if(!session->keepalive_interval) {
        if(seconds_to_next)
            *seconds_to_next = 0;
        return 0;
    }

    now = time(NULL);

    if(session->keepalive_last_sent + session->keepalive_interval <= now) {
        /* Format is
           "SSH_MSG_GLOBAL_REQUEST || 4-byte len || str || want-reply". */
        unsigned char keepalive_data[]
            = "\x50\x00\x00\x00\x15keepalive@libssh2.orgW";
        size_t len = sizeof(keepalive_data) - 1;
        int rc;

        keepalive_data[len - 1] =
            (unsigned char)session->keepalive_want_reply;

        rc = _libssh2_transport_send(session, keepalive_data, len, NULL, 0);
        /* Silently ignore PACKET_EAGAIN here: if the write buffer is
           already full, sending another keepalive is not useful. */
        if(rc && rc != LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send keepalive message");
            return rc;
        }

        session->keepalive_last_sent = now;
        if(seconds_to_next)
            *seconds_to_next = session->keepalive_interval;
    }
    else if(seconds_to_next) {
        *seconds_to_next = (int) (session->keepalive_last_sent - now)
            + session->keepalive_interval;
    }

    return 0;
}